

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_common.cpp
# Opt level: O3

void __thiscall
pstore::brokerface::fifo_path::fifo_path
          (fifo_path *this,czstring pipe_path,duration_type retry_timeout,uint max_retries,
          update_callback *cb)

{
  undefined8 uVar1;
  size_t sVar2;
  
  *(undefined8 *)
   ((long)&(this->open_server_pipe_mut_).super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)
   ((long)&(this->open_server_pipe_mut_).super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  *(undefined8 *)((long)&(this->open_server_pipe_mut_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->open_server_pipe_mut_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->open_server_pipe_mut_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->open_server_pipe_mut_).super___mutex_base._M_mutex + 8) = 0;
  if (pipe_path == (czstring)0x0) {
    get_default_path_abi_cxx11_();
  }
  else {
    (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
    sVar2 = strlen(pipe_path);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&this->path_,pipe_path,pipe_path + sVar2);
  }
  (this->retry_timeout_).__r = retry_timeout.__r;
  this->max_retries_ = max_retries;
  *(undefined8 *)&(this->update_cb_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->update_cb_).super__Function_base._M_functor + 8) = 0;
  (this->update_cb_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->update_cb_)._M_invoker = cb->_M_invoker;
  if ((cb->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(cb->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->update_cb_).super__Function_base._M_functor =
         *(undefined8 *)&(cb->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->update_cb_).super__Function_base._M_functor + 8) = uVar1;
    (this->update_cb_).super__Function_base._M_manager = (cb->super__Function_base)._M_manager;
    (cb->super__Function_base)._M_manager = (_Manager_type)0x0;
    cb->_M_invoker = (_Invoker_type)0x0;
  }
  return;
}

Assistant:

fifo_path::fifo_path (gsl::czstring const pipe_path, duration_type const retry_timeout,
                              unsigned const max_retries, update_callback cb)
                : path_{pipe_path == nullptr ? get_default_path () : pipe_path}
                , retry_timeout_{retry_timeout}
                , max_retries_{max_retries}
                , update_cb_{std::move (cb)} {}